

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationPrimitiveDiscardTests.cpp
# Opt level: O3

TestCaseGroup * vkt::tessellation::createPrimitiveDiscardTests(TestContext *testCtx)

{
  TestContext *testCtx_00;
  uint uVar1;
  bool bVar2;
  TestNode *this;
  long *plVar3;
  TestNode *node;
  undefined8 uVar4;
  byte bVar5;
  long *plVar6;
  long lVar7;
  bool bVar8;
  string caseName;
  ulong local_188;
  long local_170;
  long *local_168;
  long local_160;
  long local_158;
  long lStack_150;
  long local_148;
  uint local_140;
  uint local_13c;
  ulong local_138;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  pointer local_50;
  char *local_48;
  ulong local_40;
  char *local_38;
  
  this = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this,testCtx,"primitive_discard",
             "Test primitive discard with relevant outer tessellation level <= 0.0");
  local_188 = 0;
  do {
    local_148 = 0;
    do {
      local_50 = (pointer)(local_148 << 0x20 | local_188);
      uVar4 = CONCAT71((int7)((ulong)local_50 >> 8),1);
      local_48 = (char *)0x0;
      local_138 = 0;
      do {
        local_140 = (uint)uVar4;
        if ((char)uVar4 != '\0') {
          local_48 = "ccw";
        }
        lVar7 = 0;
        bVar8 = true;
        do {
          bVar2 = bVar8;
          bVar8 = local_148 == 1;
          bVar5 = (byte)lVar7;
          local_38 = "";
          if (lVar7 != 0) {
            local_38 = "_point_mode";
          }
          local_40 = lVar7 << 0x20 | local_138;
          local_13c = 0xb1ab01;
          local_170 = 0;
          do {
            if (((bVar8 & bVar5 & local_188 != 2) != 0) || ((char)local_170 != '\0')) {
              local_68 = 0;
              local_60 = 0;
              local_70 = &local_60;
              plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
              plVar6 = plVar3 + 2;
              if ((long *)*plVar3 == plVar6) {
                local_80 = *plVar6;
                lStack_78 = plVar3[3];
                local_90 = &local_80;
              }
              else {
                local_80 = *plVar6;
                local_90 = (long *)*plVar3;
              }
              local_88 = plVar3[1];
              *plVar3 = (long)plVar6;
              plVar3[1] = 0;
              *(undefined1 *)(plVar3 + 2) = 0;
              plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
              plVar6 = plVar3 + 2;
              if ((long *)*plVar3 == plVar6) {
                local_e0 = *plVar6;
                lStack_d8 = plVar3[3];
                local_f0 = &local_e0;
              }
              else {
                local_e0 = *plVar6;
                local_f0 = (long *)*plVar3;
              }
              local_e8 = plVar3[1];
              *plVar3 = (long)plVar6;
              plVar3[1] = 0;
              *(undefined1 *)(plVar3 + 2) = 0;
              plVar3 = (long *)std::__cxx11::string::append((char *)&local_f0);
              plVar6 = plVar3 + 2;
              if ((long *)*plVar3 == plVar6) {
                local_c0 = *plVar6;
                lStack_b8 = plVar3[3];
                local_d0 = &local_c0;
              }
              else {
                local_c0 = *plVar6;
                local_d0 = (long *)*plVar3;
              }
              local_c8 = plVar3[1];
              *plVar3 = (long)plVar6;
              plVar3[1] = 0;
              *(undefined1 *)(plVar3 + 2) = 0;
              plVar3 = (long *)std::__cxx11::string::append((char *)&local_d0);
              plVar6 = plVar3 + 2;
              if ((long *)*plVar3 == plVar6) {
                local_a0 = *plVar6;
                lStack_98 = plVar3[3];
                local_b0 = &local_a0;
              }
              else {
                local_a0 = *plVar6;
                local_b0 = (long *)*plVar3;
              }
              local_a8 = plVar3[1];
              *plVar3 = (long)plVar6;
              plVar3[1] = 0;
              *(undefined1 *)(plVar3 + 2) = 0;
              plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
              local_130 = &local_120;
              plVar6 = plVar3 + 2;
              if ((long *)*plVar3 == plVar6) {
                local_120 = *plVar6;
                lStack_118 = plVar3[3];
              }
              else {
                local_120 = *plVar6;
                local_130 = (long *)*plVar3;
              }
              local_128 = plVar3[1];
              *plVar3 = (long)plVar6;
              plVar3[1] = 0;
              *(undefined1 *)(plVar3 + 2) = 0;
              plVar3 = (long *)std::__cxx11::string::append((char *)&local_130);
              plVar6 = plVar3 + 2;
              if ((long *)*plVar3 == plVar6) {
                local_158 = *plVar6;
                lStack_150 = plVar3[3];
                local_168 = &local_158;
              }
              else {
                local_158 = *plVar6;
                local_168 = (long *)*plVar3;
              }
              local_160 = plVar3[1];
              *plVar3 = (long)plVar6;
              plVar3[1] = 0;
              *(undefined1 *)(plVar3 + 2) = 0;
              plVar3 = (long *)std::__cxx11::string::append((char *)&local_168);
              local_110 = &local_100;
              plVar6 = plVar3 + 2;
              if ((long *)*plVar3 == plVar6) {
                local_100 = *plVar6;
                lStack_f8 = plVar3[3];
              }
              else {
                local_100 = *plVar6;
                local_110 = (long *)*plVar3;
              }
              local_108 = plVar3[1];
              *plVar3 = (long)plVar6;
              plVar3[1] = 0;
              *(undefined1 *)(plVar3 + 2) = 0;
              if (local_168 != &local_158) {
                operator_delete(local_168,local_158 + 1);
              }
              if (local_130 != &local_120) {
                operator_delete(local_130,local_120 + 1);
              }
              if (local_b0 != &local_a0) {
                operator_delete(local_b0,local_a0 + 1);
              }
              if (local_d0 != &local_c0) {
                operator_delete(local_d0,local_c0 + 1);
              }
              if (local_f0 != &local_e0) {
                operator_delete(local_f0,local_e0 + 1);
              }
              if (local_90 != &local_80) {
                operator_delete(local_90,local_80 + 1);
              }
              if (local_70 != &local_60) {
                operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
              }
              local_168 = &local_158;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"");
              plVar6 = local_110;
              plVar3 = local_168;
              testCtx_00 = this->m_testCtx;
              node = (TestNode *)operator_new(0x90);
              tcu::TestCase::TestCase
                        ((TestCase *)node,testCtx_00,NODETYPE_SELF_VALIDATE,(char *)plVar6,
                         (char *)plVar3);
              node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d002b8;
              node[1]._vptr_TestNode = (_func_int **)anon_unknown_0::initPrograms;
              node[1].m_testCtx = (TestContext *)anon_unknown_0::test;
              node[1].m_name._M_dataplus._M_p = local_50;
              node[1].m_name._M_string_length = local_170 << 0x28 | local_40;
              tcu::TestNode::addChild(this,node);
              if (local_168 != &local_158) {
                operator_delete(local_168,local_158 + 1);
              }
              if (local_110 != &local_100) {
                operator_delete(local_110,local_100 + 1);
              }
            }
            lVar7 = 1;
            local_170 = 1;
            uVar1 = local_13c & 1;
            local_13c = 0;
          } while (uVar1 != 0);
          bVar8 = false;
        } while (bVar2);
        local_138 = 1;
        local_48 = "cw";
        uVar4 = 0;
      } while ((local_140 & 1) != 0);
      local_148 = local_148 + 1;
    } while (local_148 != 3);
    local_188 = local_188 + 1;
  } while (local_188 != 3);
  return (TestCaseGroup *)this;
}

Assistant:

tcu::TestCaseGroup* createPrimitiveDiscardTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> group (new tcu::TestCaseGroup(testCtx, "primitive_discard", "Test primitive discard with relevant outer tessellation level <= 0.0"));

	for (int primitiveTypeNdx = 0; primitiveTypeNdx < TESSPRIMITIVETYPE_LAST; primitiveTypeNdx++)
	for (int spacingModeNdx = 0; spacingModeNdx < SPACINGMODE_LAST; spacingModeNdx++)
	for (int windingNdx = 0; windingNdx < WINDING_LAST; windingNdx++)
	for (int usePointModeNdx = 0; usePointModeNdx <= 1; usePointModeNdx++)
	for (int lessThanOneInnerLevelsNdx = 0; lessThanOneInnerLevelsNdx <= 1; lessThanOneInnerLevelsNdx++)
	{
		const CaseDefinition caseDef =
		{
			(TessPrimitiveType)primitiveTypeNdx,
			(SpacingMode)spacingModeNdx,
			(Winding)windingNdx,
			(usePointModeNdx != 0),
			(lessThanOneInnerLevelsNdx != 0)
		};

		if (lessThanOneInnerLevelsDefined(caseDef) && !caseDef.useLessThanOneInnerLevels)
			continue; // No point generating a separate case as <= 1 inner level behavior is well-defined

		const std::string caseName = std::string() + getTessPrimitiveTypeShaderName(caseDef.primitiveType)
									 + "_" + getSpacingModeShaderName(caseDef.spacingMode)
									 + "_" + getWindingShaderName(caseDef.winding)
									 + (caseDef.usePointMode ? "_point_mode" : "")
									 + (caseDef.useLessThanOneInnerLevels ? "" : "_valid_levels");

		addFunctionCaseWithPrograms(group.get(), caseName, "", initPrograms, test, caseDef);
	}

	return group.release();
}